

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

char * tabexpand(char *sbuf)

{
  char *pcVar1;
  int local_12c;
  char *pcStack_128;
  int idx;
  char *s;
  char *bp;
  char buf [256];
  char *sbuf_local;
  
  sbuf_local = sbuf;
  if (*sbuf != '\0') {
    s = (char *)&bp;
    local_12c = 0;
    buf._248_8_ = sbuf;
    for (pcStack_128 = sbuf; *pcStack_128 != '\0'; pcStack_128 = pcStack_128 + 1) {
      if (*pcStack_128 == '\t') {
        do {
          pcVar1 = s + 1;
          *s = ' ';
          local_12c = local_12c + 1;
          s = pcVar1;
        } while (local_12c % 8 != 0);
      }
      else {
        *s = *pcStack_128;
        local_12c = local_12c + 1;
        s = s + 1;
      }
    }
    *s = '\0';
    sbuf_local = strcpy((char *)buf._248_8_,(char *)&bp);
  }
  return sbuf_local;
}

Assistant:

char *tabexpand(char *sbuf)	/* expand tabs into proper number of spaces */
{
    char buf[BUFSZ];
    char *bp, *s = sbuf;
    int idx;

    if (!*s) return sbuf;

    /* warning: no bounds checking performed */
    for (bp = buf, idx = 0; *s; s++)
	if (*s == '\t') {
	    do *bp++ = ' '; while (++idx % 8);
	} else {
	    *bp++ = *s;
	    idx++;
	}
    *bp = 0;
    return strcpy(sbuf, buf);
}